

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChBody::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChBody *this,ChVector<double> *loc_point,
          ChState *state_x,ChStateDelta *state_w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChVector<double> *v;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChVector<double> abs_omg;
  ChVector<double> abs_vel;
  ChVector<double> loc_omg;
  ChCoordsys<double> csys;
  double *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  ChState *local_a8;
  undefined8 local_a0;
  long local_90;
  ChVector<double> local_88;
  ChVector<double> local_70;
  ChCoordsys<double> local_58;
  
  local_c0 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_90 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_b8 = 3.45845952088873e-323;
  local_a0 = 0;
  local_a8 = state_x;
  if (6 < local_90) {
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_58,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_c0,(type *)0x0);
    local_c0 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_90 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_b8 = 1.48219693752374e-323;
    local_a0 = 0;
    local_a8 = (ChState *)state_w;
    if (2 < local_90) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_88,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_c0,(type *)0x0);
      local_90 = (state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_c0 = (state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3
      ;
      local_b8 = 1.48219693752374e-323;
      local_a0 = 3;
      local_a8 = (ChState *)state_w;
      if (5 < local_90) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_70,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_c0,(type *)0x0);
        ChCoordsys<double>::TransformDirectionLocalToParent(&local_58,&local_70);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_c0;
        auVar6._8_8_ = uStack_b0;
        auVar6._0_8_ = uStack_b0;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = loc_point->m_data[0];
        auVar8._8_8_ = loc_point->m_data[2];
        auVar8._0_8_ = loc_point->m_data[2];
        auVar2._8_8_ = uStack_b0;
        auVar2._0_8_ = local_b8;
        auVar1 = *(undefined1 (*) [16])(loc_point->m_data + 1);
        auVar4 = vunpcklpd_avx(auVar6,auVar5);
        auVar3 = vunpcklpd_avx(auVar8,auVar3);
        auVar7._0_8_ = auVar1._0_8_ * auVar4._0_8_;
        auVar7._8_8_ = auVar1._8_8_ * auVar4._8_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = loc_point->m_data[0] * local_b8;
        auVar4 = vfmsub231sd_fma(auVar4,auVar5,auVar1);
        auVar1 = vfmsub213pd_fma(auVar3,auVar2,auVar7);
        __return_storage_ptr__->m_data[0] = auVar1._0_8_ + local_88.m_data[0];
        __return_storage_ptr__->m_data[1] = auVar1._8_8_ + local_88.m_data[1];
        __return_storage_ptr__->m_data[2] = auVar4._0_8_ + local_88.m_data[2];
        return __return_storage_ptr__;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

ChVector<> ChBody::GetContactPointSpeed(const ChVector<>& loc_point,
                                        const ChState& state_x,
                                        const ChStateDelta& state_w) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> abs_vel(state_w.segment(0, 3));
    ChVector<> loc_omg(state_w.segment(3, 3));
    ChVector<> abs_omg = csys.TransformDirectionLocalToParent(loc_omg);

    return abs_vel + Vcross(abs_omg, loc_point);
}